

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

cmFileLockResult __thiscall cmFileLockPool::ScopePool::Release(ScopePool *this,string *filename)

{
  bool bVar1;
  reference ppcVar2;
  cmFileLockResult cVar3;
  _Self local_30;
  _Self local_28;
  It i;
  string *filename_local;
  ScopePool *this_local;
  
  i._M_node = (_List_node_base *)filename;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<cmFileLock_*,_std::allocator<cmFileLock_*>_>::begin(&this->Locks);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<cmFileLock_*,_std::allocator<cmFileLock_*>_>::end(&this->Locks);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      cVar3 = cmFileLockResult::MakeOk();
      return cVar3;
    }
    ppcVar2 = std::_List_iterator<cmFileLock_*>::operator*(&local_28);
    bVar1 = cmFileLock::IsLocked(*ppcVar2,(string *)i._M_node);
    if (bVar1) break;
    std::_List_iterator<cmFileLock_*>::operator++(&local_28);
  }
  ppcVar2 = std::_List_iterator<cmFileLock_*>::operator*(&local_28);
  cVar3 = cmFileLock::Release(*ppcVar2);
  return cVar3;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Release(
    const std::string& filename)
{
  for (It i = this->Locks.begin(); i != this->Locks.end(); ++i)
    {
    if ((*i)->IsLocked(filename))
      {
      return (*i)->Release();
      }
    }
  return cmFileLockResult::MakeOk();
}